

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O1

__pid_t __thiscall procxx::process::wait(process *this,void *__stat_loc)

{
  __pid_t in_EAX;
  pipe_end pVar1;
  
  if (this->waited_ == false) {
    pVar1 = pipe_t::write_end();
    pipe_streambuf::close(&this->pipe_buf_,pVar1.end_);
    pVar1 = pipe_t::write_end();
    pipe_ostreambuf::close(&this->err_buf_,pVar1.end_);
    in_EAX = waitpid(this->pid_,&this->status_,0);
    this->pid_ = -1;
    this->waited_ = true;
  }
  return in_EAX;
}

Assistant:

void wait() {
    if (!waited_) {
      pipe_buf_.close(pipe_t::write_end());
      err_buf_.close(pipe_t::write_end());
      waitpid(pid_, &status_, 0);
      pid_ = -1;
      waited_ = true;
    }
  }